

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cpp
# Opt level: O3

deque<Patch,_std::allocator<Patch>_> * __thiscall
diff_match_patch::patch_deepCopy
          (deque<Patch,_std::allocator<Patch>_> *__return_storage_ptr__,diff_match_patch *this,
          deque<Patch,_std::allocator<Patch>_> *patches)

{
  _Elt_pointer pPVar1;
  _Elt_pointer pDVar2;
  _Elt_pointer pPVar3;
  _Elt_pointer pDVar4;
  _Elt_pointer pDVar5;
  _Map_pointer ppDVar6;
  Diff diffCopy;
  _Map_pointer local_d8;
  _Elt_pointer local_d0;
  Diff local_b8;
  Patch local_90;
  
  (__return_storage_ptr__->super__Deque_base<Patch,_std::allocator<Patch>_>)._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Patch,_std::allocator<Patch>_>)._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Patch,_std::allocator<Patch>_>)._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Patch,_std::allocator<Patch>_>)._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Patch,_std::allocator<Patch>_>)._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Patch,_std::allocator<Patch>_>)._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Patch,_std::allocator<Patch>_>)._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Patch,_std::allocator<Patch>_>)._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Patch,_std::allocator<Patch>_>)._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Patch,_std::allocator<Patch>_>)._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Patch,_std::allocator<Patch>_>::_M_initialize_map
            (&__return_storage_ptr__->super__Deque_base<Patch,_std::allocator<Patch>_>,0);
  pPVar3 = (patches->super__Deque_base<Patch,_std::allocator<Patch>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pPVar1 = (patches->super__Deque_base<Patch,_std::allocator<Patch>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pPVar3 != pPVar1) {
    local_d0 = (patches->super__Deque_base<Patch,_std::allocator<Patch>_>)._M_impl.
               super__Deque_impl_data._M_start._M_last;
    local_d8 = (patches->super__Deque_base<Patch,_std::allocator<Patch>_>)._M_impl.
               super__Deque_impl_data._M_start._M_node;
    do {
      Patch::Patch(&local_90);
      pDVar5 = (pPVar3->diffs).super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      pDVar2 = (pPVar3->diffs).super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pDVar5 != pDVar2) {
        pDVar4 = (pPVar3->diffs).super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last;
        ppDVar6 = (pPVar3->diffs).super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node;
        do {
          Diff::Diff(&local_b8,pDVar5->operation,&pDVar5->text);
          std::deque<Diff,_std::allocator<Diff>_>::push_back(&local_90.diffs,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_b8.text._M_dataplus._M_p != &local_b8.text.field_2) {
            operator_delete(local_b8.text._M_dataplus._M_p,
                            local_b8.text.field_2._M_allocated_capacity * 4 + 4);
          }
          pDVar5 = pDVar5 + 1;
          if (pDVar5 == pDVar4) {
            pDVar5 = ppDVar6[1];
            ppDVar6 = ppDVar6 + 1;
            pDVar4 = pDVar5 + 0xc;
          }
        } while (pDVar5 != pDVar2);
      }
      local_90.start1 = pPVar3->start1;
      local_90.start2 = pPVar3->start2;
      local_90.length1 = pPVar3->length1;
      local_90.length2 = pPVar3->length2;
      std::deque<Patch,_std::allocator<Patch>_>::push_back(__return_storage_ptr__,&local_90);
      std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_90.diffs);
      pPVar3 = pPVar3 + 1;
      if (pPVar3 == local_d0) {
        pPVar3 = local_d8[1];
        local_d8 = local_d8 + 1;
        local_d0 = pPVar3 + 5;
      }
    } while (pPVar3 != pPVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::deque<Patch> diff_match_patch::patch_deepCopy(std::deque<Patch> &patches) {
  std::deque<Patch> patchesCopy;
  for (const Patch& aPatch : patches) {
    Patch patchCopy = Patch();
    for (const Diff& aDiff : aPatch.diffs) {
      Diff diffCopy = Diff(aDiff.operation, aDiff.text);
      patchCopy.diffs.push_back(diffCopy);
    }
    patchCopy.start1 = aPatch.start1;
    patchCopy.start2 = aPatch.start2;
    patchCopy.length1 = aPatch.length1;
    patchCopy.length2 = aPatch.length2;
    patchesCopy.push_back(patchCopy);
  }
  return patchesCopy;
}